

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<google::protobuf::(anonymous_namespace)::DynamicMessageTest_PackedFields_Test>
::CreateTest(ParameterizedTestFactory<google::protobuf::(anonymous_namespace)::DynamicMessageTest_PackedFields_Test>
             *this)

{
  DynamicMessageTest *this_00;
  
  WithParamInterface<std::tuple<bool,bool>>::parameter_ = &this->parameter_;
  this_00 = (DynamicMessageTest *)operator_new(0x130);
  google::protobuf::anon_unknown_0::DynamicMessageTest::DynamicMessageTest(this_00);
  (this_00->super_TestWithParam<std::tuple<bool,_bool>_>).super_Test._vptr_Test =
       (_func_int **)&PTR__DynamicMessageTest_0160a4e8;
  (this_00->super_TestWithParam<std::tuple<bool,_bool>_>).
  super_WithParamInterface<std::tuple<bool,_bool>_>._vptr_WithParamInterface =
       (_func_int **)&DAT_0160a528;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }